

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool __thiscall Catch::TestSpec::Filter::matches(Filter *this,TestCaseInfo *testCase)

{
  pointer psVar1;
  element_type *peVar2;
  int iVar3;
  pointer psVar4;
  long lVar5;
  pointer psVar6;
  
  psVar4 = (this->m_patterns).
           super__Vector_base<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->m_patterns).
           super__Vector_base<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)psVar1 - (long)psVar4 >> 6;
  if (0 < lVar5) {
    lVar5 = lVar5 + 1;
    psVar4 = psVar4 + 2;
    do {
      psVar6 = psVar4;
      peVar2 = psVar6[-2].super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      iVar3 = (*peVar2->_vptr_Pattern[2])(peVar2,testCase);
      if ((char)iVar3 == '\0') {
        psVar6 = psVar6 + -2;
        goto LAB_0012bbbe;
      }
      peVar2 = psVar6[-1].super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      iVar3 = (*peVar2->_vptr_Pattern[2])(peVar2,testCase);
      if ((char)iVar3 == '\0') {
        psVar6 = psVar6 + -1;
        goto LAB_0012bbbe;
      }
      peVar2 = (psVar6->super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      iVar3 = (*peVar2->_vptr_Pattern[2])(peVar2,testCase);
      if ((char)iVar3 == '\0') goto LAB_0012bbbe;
      peVar2 = psVar6[1].super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      iVar3 = (*peVar2->_vptr_Pattern[2])(peVar2,testCase);
      if ((char)iVar3 == '\0') {
        psVar6 = psVar6 + 1;
        goto LAB_0012bbbe;
      }
      lVar5 = lVar5 + -1;
      psVar4 = psVar6 + 4;
    } while (1 < lVar5);
    psVar4 = psVar6 + 2;
  }
  lVar5 = (long)psVar1 - (long)psVar4 >> 4;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      psVar6 = psVar1;
      if ((lVar5 != 3) ||
         (peVar2 = (psVar4->super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr, iVar3 = (*peVar2->_vptr_Pattern[2])(peVar2,testCase), psVar6 = psVar4,
         (char)iVar3 == '\0')) goto LAB_0012bbbe;
      psVar4 = psVar4 + 1;
    }
    peVar2 = (psVar4->super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    iVar3 = (*peVar2->_vptr_Pattern[2])(peVar2,testCase);
    psVar6 = psVar4;
    if ((char)iVar3 == '\0') goto LAB_0012bbbe;
    psVar4 = psVar4 + 1;
  }
  peVar2 = (psVar4->super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  iVar3 = (*peVar2->_vptr_Pattern[2])(peVar2,testCase);
  psVar6 = psVar4;
  if ((char)iVar3 != '\0') {
    psVar6 = psVar1;
  }
LAB_0012bbbe:
  return psVar6 == psVar1;
}

Assistant:

bool TestSpec::Filter::matches( TestCaseInfo const& testCase ) const {
        return std::all_of( m_patterns.begin(), m_patterns.end(), [&]( PatternPtr const& p ){ return p->matches( testCase ); } );
    }